

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O3

int add_conterexample(saucy *s,sim_result *cex)

{
  uint uVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  uint uVar4;
  int extraout_EAX;
  void **ppvVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  size_t __size;
  
  lVar6 = (long)s->pNtk->vPis->nSize;
  cex->inVecSignature = 0;
  if (lVar6 < 1) {
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
    lVar8 = 0;
    do {
      if (cex->inVec[lVar8] != 0) {
        uVar4 = uVar4 + (int)lVar8 * (int)lVar8 * cex->inVec[lVar8] ^ 0xabcd;
        cex->inVecSignature = uVar4;
      }
      lVar8 = lVar8 + 1;
    } while (lVar6 != lVar8);
  }
  pVVar3 = s->satCounterExamples;
  uVar1 = pVVar3->nSize;
  if (0 < (int)uVar1) {
    uVar7 = 0;
    do {
      if (*(uint *)((long)pVVar3->pArray[uVar7] + 0x10) == uVar4) {
        return uVar4;
      }
      uVar7 = uVar7 + 1;
    } while (uVar1 != uVar7);
  }
  if (uVar1 == pVVar3->nCap) {
    if ((int)uVar1 < 0x10) {
      if (pVVar3->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc(0x80);
      }
      else {
        ppvVar5 = (void **)realloc(pVVar3->pArray,0x80);
      }
      pVVar3->pArray = ppvVar5;
      pVVar3->nCap = 0x10;
    }
    else {
      __size = (ulong)uVar1 << 4;
      if (pVVar3->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc(__size);
      }
      else {
        ppvVar5 = (void **)realloc(pVVar3->pArray,__size);
      }
      pVVar3->pArray = ppvVar5;
      pVVar3->nCap = uVar1 * 2;
    }
  }
  else {
    ppvVar5 = pVVar3->pArray;
  }
  iVar2 = pVVar3->nSize;
  pVVar3->nSize = iVar2 + 1;
  ppvVar5[iVar2] = cex;
  bumpActivity(s,cex);
  return extraout_EAX;
}

Assistant:

static int
add_conterexample(struct saucy *s, struct sim_result * cex)
{
    int i;
    int nins = Abc_NtkPiNum(s->pNtk);
    struct sim_result * savedcex;
    
    cex->inVecSignature = 0;
    for (i = 0; i < nins; i++) {
        if (cex->inVec[i]) {
            cex->inVecSignature += (cex->inVec[i] * i * i);
            cex->inVecSignature ^= 0xABCD;
        }
    }

    for (i = 0; i < Vec_PtrSize(s->satCounterExamples); i++) {
        savedcex = (struct sim_result *)Vec_PtrEntry(s->satCounterExamples, i);
        if (savedcex->inVecSignature == cex->inVecSignature) {
            //bumpActivity(s, savedcex);
            return 0;
        }
    }
    
    Vec_PtrPush(s->satCounterExamples, cex);
    bumpActivity(s, cex);
    return 1;
}